

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall xLearn::MODEL_TEST_Init_ffm_Test::TestBody(MODEL_TEST_Init_ffm_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_7;
  index_t j_1;
  index_t i_1;
  AssertionResult gtest_ar_6;
  index_t j;
  AssertionResult gtest_ar_5;
  real_t in_stack_00000110;
  index_t i;
  index_t aux_size;
  index_t len;
  string *in_stack_00000120;
  string *in_stack_00000128;
  AssertionResult gtest_ar_4;
  index_t in_stack_00000140;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  index_t param_num_v;
  real_t *v;
  index_t param_num_w;
  real_t *w;
  real_t *b;
  Model model_ffm;
  HyperParam hyper_param;
  HyperParam *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  char *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  AssertHelper local_418;
  Message local_410;
  AssertionResult local_408;
  uint local_3f8;
  uint local_3f4;
  AssertHelper local_3f0;
  Message local_3e8;
  AssertionResult local_3e0;
  uint local_3cc;
  AssertHelper local_3c8;
  Message local_3c0;
  AssertionResult local_3b8;
  uint local_3a4;
  uint local_3a0;
  uint local_39c;
  AssertHelper local_398;
  Message local_390;
  AssertionResult local_388;
  AssertHelper local_378;
  Message local_370;
  AssertionResult local_368;
  AssertHelper local_358;
  Message local_350;
  index_t local_348;
  int local_344;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  index_t local_31c;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  index_t local_2f4;
  AssertionResult local_2f0;
  int local_2dc;
  real_t *local_2d8;
  int local_2cc;
  real_t *local_2c8;
  real_t *local_2c0;
  Model local_2a8 [2];
  uint local_188;
  int local_160;
  int local_158;
  int local_154;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  
  Init();
  Model::Model((Model *)in_stack_fffffffffffffb50);
  Model::Initialize((Model *)gtest_ar_4._0_8_,in_stack_00000128,in_stack_00000120,len,aux_size,i,
                    in_stack_00000140,in_stack_00000110);
  local_2c0 = Model::GetParameter_b(local_2a8);
  local_2c8 = Model::GetParameter_w(local_2a8);
  local_2cc = local_160 * 2;
  local_2d8 = Model::GetParameter_v(local_2a8);
  local_2dc = local_160 * local_154 * local_158 * 2;
  local_2f4 = Model::GetNumParameter_w(local_2a8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (uint *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (uint *)in_stack_fffffffffffffb50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13cc7e);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::Message::~Message((Message *)0x13ccdb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13cd30);
  local_31c = Model::GetNumParameter_v(local_2a8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (uint *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (uint *)in_stack_fffffffffffffb50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13cde4);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message((Message *)0x13ce41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ce99);
  local_344 = local_2dc + 2 + local_2cc;
  local_348 = Model::GetNumParameter(local_2a8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (uint *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             (uint *)in_stack_fffffffffffffb50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13cf6a);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message((Message *)0x13cfc7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d01c);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             in_stack_ffffffffffffff08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_368);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13d0b2);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message((Message *)0x13d10f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d164);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             in_stack_ffffffffffffff08);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_388);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13d1ff);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message((Message *)0x13d25c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d2b4);
  local_39c = Model::GetNumParameter_w(local_2a8);
  local_3a0 = local_188;
  for (local_3a4 = 0; local_3a4 < local_39c; local_3a4 = local_3a0 + local_3a4) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff08);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13d39d);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x44,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper(&local_3c8);
      testing::Message::~Message((Message *)0x13d3fa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d452);
    for (local_3cc = 1; local_3cc < local_3a0; local_3cc = local_3cc + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 in_stack_ffffffffffffff08);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e0);
      if (!bVar1) {
        testing::Message::Message(&local_3e8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x13d51c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x46,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3f0,&local_3e8);
        testing::internal::AssertHelper::~AssertHelper(&local_3f0);
        testing::Message::~Message((Message *)0x13d579);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d5ce);
    }
  }
  local_39c = Model::GetNumParameter_v(local_2a8);
  for (local_3f4 = 0; local_3f4 < local_39c; local_3f4 = local_3a0 * 4 + local_3f4) {
    for (local_3f8 = 1; local_3f8 < local_3a0; local_3f8 = local_3f8 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 in_stack_ffffffffffffff08);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
      if (!bVar1) {
        testing::Message::Message(&local_410);
        in_stack_fffffffffffffb50 =
             (HyperParam *)testing::AssertionResult::failure_message((AssertionResult *)0x13d70c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_418,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x4d,(char *)in_stack_fffffffffffffb50);
        testing::internal::AssertHelper::operator=(&local_418,&local_410);
        testing::internal::AssertHelper::~AssertHelper(&local_418);
        testing::Message::~Message((Message *)0x13d769);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d7be);
    }
  }
  Model::~Model((Model *)in_stack_fffffffffffffb50);
  HyperParam::~HyperParam(in_stack_fffffffffffffb50);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_ffm) {
  HyperParam hyper_param = Init();
  Model model_ffm;
  model_ffm.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size);
  real_t* b = model_ffm.GetParameter_b();
  real_t* w = model_ffm.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_ffm.GetParameter_v();
  index_t param_num_v = hyper_param.num_feature *
                      hyper_param.num_field *
                      hyper_param.num_K * 2;
  EXPECT_EQ(param_num_w, model_ffm.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_ffm.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_ffm.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t len = model_ffm.GetNumParameter_w();
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < len; i += aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }

  }
  len = model_ffm.GetNumParameter_v();
  for (index_t i = 0; i < len; i+=(kAlign*aux_size)) {
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(v[i+kAlign*j], 1.0);
    }
  }
}